

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::Inst::PrintBytes<UnifiedRegex::Inst>
          (Inst *this,DebugWriter *w,Inst *inst,Inst *that,char16 *annotation)

{
  DebugWriter::Print(w,L"0x%p[+0x%03x](0x%03x) [%s]:",that,0,1,annotation);
  if (that < that + 1) {
    DebugWriter::Print(w,L"%02x",(ulong)that->tag);
  }
  DebugWriter::PrintEOL(w,L"");
  return;
}

Assistant:

void Inst::PrintBytes(DebugWriter *w, Inst *inst, Inst *that, const char16 *annotation) const
    {
        Inst *start = (Inst *)that;

        size_t baseSize = sizeof(*(Inst *)that);
        ptrdiff_t offsetToData = (byte *)&(start->tag) - ((byte *)start);
        size_t size = baseSize - offsetToData;

        byte *startByte = (byte *)(&(start->tag));
        byte *endByte = startByte + size;
        byte *currentByte = startByte;
        w->Print(_u("0x%p[+0x%03x](0x%03x) [%s]:"), startByte, offsetToData, size, annotation);
        for (; currentByte < endByte; ++currentByte)
        {
            if ((currentByte - endByte) % 4 == 0)
            {
                w->Print(_u(" "), *currentByte);
            }
            w->Print(_u("%02x"), *currentByte);
        }
        w->PrintEOL(_u(""));
    }